

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
          (VulkanSyncObjectManager *this,VulkanRecycledSemaphore *pSemaphores,uint32_t Count)

{
  PFN_vkCreateSemaphore p_Var1;
  bool bVar2;
  reference ppVVar3;
  VkDevice pVVar4;
  byte local_c1;
  enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager> local_b8;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> local_a8;
  VkSemaphore local_88;
  VkSemaphore vkSem;
  VkSemaphoreCreateInfo SemCI;
  enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager> local_58;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> local_48;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> Lock;
  uint32_t SemIdx;
  uint32_t Count_local;
  VulkanRecycledSemaphore *pSemaphores_local;
  VulkanSyncObjectManager *this_local;
  
  Lock._M_device._0_4_ = 0;
  Lock._M_device._4_4_ = Count;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_SemaphorePoolGuard);
  while( true ) {
    local_c1 = 0;
    if ((uint)Lock._M_device < Lock._M_device._4_4_) {
      bVar2 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::empty
                        (&this->m_SemaphorePool);
      local_c1 = bVar2 ^ 0xff;
    }
    if ((local_c1 & 1) == 0) break;
    std::enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>::shared_from_this
              (&local_58);
    ppVVar3 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::back
                        (&this->m_SemaphorePool);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::RecycledSyncObject
              (&local_48,(shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_58,*ppVVar3)
    ;
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::operator=
              (pSemaphores + (uint)Lock._M_device,&local_48);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(&local_48);
    std::shared_ptr<VulkanUtilities::VulkanSyncObjectManager>::~shared_ptr
              ((shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_58);
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::pop_back(&this->m_SemaphorePool)
    ;
    Lock._M_device._0_4_ = (uint)Lock._M_device + 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  memset(&vkSem,0,0x18);
  vkSem._0_4_ = 9;
  for (; p_Var1 = vkCreateSemaphore, (uint)Lock._M_device < Lock._M_device._4_4_;
      Lock._M_device._0_4_ = (uint)Lock._M_device + 1) {
    local_88 = (NativeType)0x0;
    pVVar4 = VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
    (*p_Var1)(pVVar4,(VkSemaphoreCreateInfo *)&vkSem,(VkAllocationCallbacks *)0x0,&local_88);
    std::enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>::shared_from_this
              (&local_b8);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::RecycledSyncObject
              (&local_a8,(shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_b8,local_88)
    ;
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::operator=
              (pSemaphores + (uint)Lock._M_device,&local_a8);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(&local_a8);
    std::shared_ptr<VulkanUtilities::VulkanSyncObjectManager>::~shared_ptr
              ((shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_b8);
  }
  return;
}

Assistant:

void VulkanSyncObjectManager::CreateSemaphores(VulkanRecycledSemaphore* pSemaphores, uint32_t Count)
{
    uint32_t SemIdx = 0;
    {
        std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};
        for (; SemIdx < Count && !m_SemaphorePool.empty(); ++SemIdx)
        {
            pSemaphores[SemIdx] = VulkanRecycledSemaphore{shared_from_this(), m_SemaphorePool.back()};
            m_SemaphorePool.pop_back();
        }
    }

    // Create new semaphores.
    VkSemaphoreCreateInfo SemCI{};
    SemCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;

    for (; SemIdx < Count; ++SemIdx)
    {
        VkSemaphore vkSem = VK_NULL_HANDLE;
        vkCreateSemaphore(m_LogicalDevice.GetVkDevice(), &SemCI, nullptr, &vkSem);
        pSemaphores[SemIdx] = VulkanRecycledSemaphore{shared_from_this(), vkSem};
    }
}